

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockwise.c
# Opt level: O0

void cf_blockwise_xor(uint8_t *partial,size_t *npartial,size_t nblock,void *inp,void *outp,
                     size_t nbytes,cf_blockwise_out_fn process,void *ctx)

{
  uint8_t *local_78;
  size_t __y;
  size_t __x;
  size_t taken;
  size_t offset;
  uint8_t *outb;
  uint8_t *inb;
  size_t nbytes_local;
  void *outp_local;
  void *inp_local;
  size_t nblock_local;
  size_t *npartial_local;
  uint8_t *partial_local;
  
  if ((partial == (uint8_t *)0x0) || (nblock <= *npartial)) {
    abort();
  }
  if ((inp == (void *)0x0) && (nbytes != 0)) {
    abort();
  }
  if ((process != (cf_blockwise_out_fn)0x0) &&
     (offset = (size_t)outp, outb = (uint8_t *)inp, inb = (uint8_t *)nbytes, ctx != (void *)0x0)) {
    for (; inb != (uint8_t *)0x0; inb = inb + -(long)local_78) {
      if (*npartial == 0) {
        (*process)(ctx,partial);
        *npartial = nblock;
      }
      local_78 = (uint8_t *)*npartial;
      if (inb <= local_78) {
        local_78 = inb;
      }
      xor_bb((uint8_t *)offset,outb,partial + (nblock - *npartial),(size_t)local_78);
      *npartial = *npartial - (long)local_78;
      offset = (size_t)(local_78 + offset);
      outb = local_78 + (long)outb;
    }
    return;
  }
  abort();
}

Assistant:

void cf_blockwise_xor(uint8_t *partial, size_t *npartial, size_t nblock,
                      const void *inp, void *outp, size_t nbytes,
                      cf_blockwise_out_fn process, void *ctx)
{
  const uint8_t *inb = inp;
  uint8_t *outb = outp;

  assert(partial && *npartial < nblock);
  assert(inp || !nbytes);
  assert(process && ctx);

  while (nbytes)
  {
    /* If we're out of material, and need more, produce a block. */
    if (*npartial == 0)
    {
      process(ctx, partial);
      *npartial = nblock;
    }

    size_t offset = nblock - *npartial;
    size_t taken = MIN(*npartial, nbytes);
    xor_bb(outb, inb, partial + offset, taken);
    *npartial -= taken;
    nbytes -= taken;
    outb += taken;
    inb += taken;
  }
}